

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int monty_reduce_internal(MontyContext *mc,mp_int *x,mp_int scratch)

{
  ulong uVar1;
  mp_int *b;
  uint uVar2;
  BignumInt *pBVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  BignumInt BVar8;
  BignumInt *pBVar9;
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int mVar10;
  mp_int x_lo;
  mp_int k;
  mp_int mk;
  mp_int toret;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  pBVar3 = scratch.w;
  uVar5 = scratch.nw;
  local_70.w = x->w;
  local_70.nw = mc->rbits;
  if (x->nw < mc->rbits) {
    local_70.nw = x->nw;
  }
  uVar1 = mc->rw;
  if (uVar1 <= uVar5) {
    if (uVar5 - uVar1 < uVar5) {
      uVar5 = uVar5 - uVar1;
    }
    pBVar9 = pBVar3 + uVar1;
    scratch_00.w = pBVar9;
    scratch_00.nw = uVar5;
    local_60.nw = uVar1;
    local_60.w = pBVar3;
    mp_mul_internal(&local_60,&local_70,mc->minus_minv_mod_r,scratch_00);
    uVar1 = mc->pw;
    if (uVar1 <= uVar5) {
      if (uVar5 - uVar1 < uVar5) {
        uVar5 = uVar5 - uVar1;
      }
      scratch_01.w = pBVar9 + uVar1;
      scratch_01.nw = uVar5;
      local_50.nw = uVar1;
      local_50.w = pBVar9;
      mp_mul_internal(&local_50,mc->m,&local_60,scratch_01);
      if (uVar1 != 0) {
        uVar5 = x->nw;
        uVar6 = 0;
        uVar4 = 0;
        do {
          if (uVar4 < uVar5) {
            BVar8 = x->w[uVar4];
          }
          else {
            BVar8 = 0;
          }
          uVar7 = BVar8 + uVar6;
          uVar6 = (ulong)CARRY8(BVar8,uVar6) + (ulong)CARRY8(uVar7,pBVar9[uVar4]);
          if (pBVar3 != (BignumInt *)0x0) {
            pBVar9[uVar4] = uVar7 + pBVar9[uVar4];
          }
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      uVar5 = mc->rw;
      uVar4 = uVar5;
      if (uVar1 < uVar5) {
        uVar4 = uVar1;
      }
      uVar6 = uVar1 - uVar4;
      if (uVar1 - uVar5 <= uVar1 - uVar4) {
        uVar6 = uVar1 - uVar5;
      }
      pBVar9 = pBVar9 + uVar4;
      b = mc->m;
      local_40.nw = uVar6;
      local_40.w = pBVar9;
      uVar2 = mp_cmp_hs(&local_40,b);
      BVar8 = -(ulong)uVar2;
      mp_add_masked_into(pBVar9,uVar6,&local_40,b,BVar8,BVar8,(ulong)((uint)BVar8 & 1));
      mVar10.w = pBVar9;
      mVar10.nw = uVar6;
      return mVar10;
    }
  }
  __assert_fail("len <= pool->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
}

Assistant:

static mp_int monty_reduce_internal(MontyContext *mc, mp_int *x, mp_int scratch)
{
    /*
     * The trick with Montgomery reduction is that on the one hand we
     * want to reduce the size of the input by a factor of about r,
     * and on the other hand, the two numbers we just multiplied were
     * both stored with an extra factor of r multiplied in. So we
     * computed ar*br = ab r^2, but we want to return abr, so we need
     * to divide by r - and if we can do that by _actually dividing_
     * by r then this also reduces the size of the number.
     *
     * But we can only do that if the number we're dividing by r is a
     * multiple of r. So first we must add an adjustment to it which
     * clears its bottom 'rbits' bits. That adjustment must be a
     * multiple of m in order to leave the residue mod n unchanged, so
     * the question is, what multiple of m can we add to x to make it
     * congruent to 0 mod r? And the answer is, x * (-m)^{-1} mod r.
     */

    /* x mod r */
    mp_int x_lo = mp_make_alias(x, 0, mc->rbits);

    /* x * (-m)^{-1}, i.e. the number we want to multiply by m */
    mp_int k = mp_alloc_from_scratch(&scratch, mc->rw);
    mp_mul_internal(&k, &x_lo, mc->minus_minv_mod_r, scratch);

    /* m times that, i.e. the number we want to add to x */
    mp_int mk = mp_alloc_from_scratch(&scratch, mc->pw);
    mp_mul_internal(&mk, mc->m, &k, scratch);

    /* Add it to x */
    mp_add_into(&mk, x, &mk);

    /* Reduce mod r, by simply making an alias to the upper words of x */
    mp_int toret = mp_make_alias(&mk, mc->rw, mk.nw - mc->rw);

    /*
     * We'll generally be doing this after a multiplication of two
     * fully reduced values. So our input could be anything up to m^2,
     * and then we added up to rm to it. Hence, the maximum value is
     * rm+m^2, and after dividing by r, that becomes r + m(m/r) < 2r.
     * So a single trial-subtraction will finish reducing to the
     * interval [0,m).
     */
    mp_cond_sub_into(&toret, &toret, mc->m, mp_cmp_hs(&toret, mc->m));
    return toret;
}